

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void property_sel_repeat_new_proc(Am_Object *command_obj,Am_Value *new_sel,Am_Value *new_value)

{
  Am_Value local_58 [2];
  Am_Value local_38;
  Am_Object local_28;
  Am_Value *local_20;
  Am_Value *new_value_local;
  Am_Value *new_sel_local;
  Am_Object *command_obj_local;
  
  local_20 = new_value;
  new_value_local = new_sel;
  new_sel_local = (Am_Value *)command_obj;
  Am_Object::Am_Object(&local_28,command_obj);
  Am_Value::Am_Value(&local_38,new_sel);
  Am_Value::Am_Value(local_58,new_value);
  change_property_general_undo_redo(&local_28,false,true,true,&local_38,local_58);
  Am_Value::~Am_Value(local_58);
  Am_Value::~Am_Value(&local_38);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void, property_sel_repeat_new,
                 (Am_Object command_obj, Am_Value new_sel, Am_Value new_value))
{
  change_property_general_undo_redo(command_obj, false, true, true, new_sel,
                                    new_value);
}